

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileImporter.cpp
# Opt level: O1

void __thiscall
Assimp::Q3BSPFileImporter::CreateNodes
          (Q3BSPFileImporter *this,Q3BSPModel *pModel,aiScene *pScene,aiNode *pParent)

{
  vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_> *faceArray;
  aiNode *paVar1;
  Q3BSPFileImporter *this_00;
  size_t sVar2;
  Q3BSPFileImporter *pQVar3;
  aiMesh **ppaVar4;
  ulong uVar5;
  aiNode **ppaVar6;
  Q3BSPFileImporter *pQVar7;
  uint uVar8;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> MeshArray;
  vector<aiNode_*,_std::allocator<aiNode_*>_> NodeArray;
  aiMesh *pMesh;
  aiNode *pNode;
  aiMesh **local_88;
  iterator iStack_80;
  aiMesh **local_78;
  aiNode **local_68;
  iterator iStack_60;
  aiNode **local_58;
  aiMesh *local_50;
  aiScene *local_48;
  Q3BSPModel *local_40;
  aiNode *local_38;
  
  if (pModel != (Q3BSPModel *)0x0) {
    local_88 = (aiMesh **)0x0;
    iStack_80._M_current = (aiMesh **)0x0;
    uVar8 = 0;
    local_78 = (aiMesh **)0x0;
    local_58 = (aiNode **)0x0;
    local_68 = (aiNode **)0x0;
    iStack_60._M_current = (aiNode **)0x0;
    pQVar3 = (Q3BSPFileImporter *)
             (this->m_MaterialLookupMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    this_00 = this;
    local_40 = pModel;
    while (pQVar7 = pQVar3, local_48 = pScene,
          pQVar7 != (Q3BSPFileImporter *)
                    &(this->m_MaterialLookupMap)._M_t._M_impl.super__Rb_tree_header) {
      faceArray = (vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>
                   *)(pQVar7->super_BaseImporter).importerScale;
      sVar2 = countData(this_00,faceArray);
      if (sVar2 != 0) {
        local_50 = (aiMesh *)0x0;
        local_38 = CreateTopology(this,local_40,uVar8,faceArray,&local_50);
        if (local_38 != (aiNode *)0x0) {
          if (iStack_60._M_current == local_58) {
            std::vector<aiNode*,std::allocator<aiNode*>>::_M_realloc_insert<aiNode*const&>
                      ((vector<aiNode*,std::allocator<aiNode*>> *)&local_68,iStack_60,&local_38);
          }
          else {
            *iStack_60._M_current = local_38;
            iStack_60._M_current = iStack_60._M_current + 1;
          }
          if (iStack_80._M_current == local_78) {
            std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                      ((vector<aiMesh*,std::allocator<aiMesh*>> *)&local_88,iStack_80,&local_50);
          }
          else {
            *iStack_80._M_current = local_50;
            iStack_80._M_current = iStack_80._M_current + 1;
          }
        }
      }
      uVar8 = uVar8 + 1;
      pQVar3 = (Q3BSPFileImporter *)std::_Rb_tree_increment((_Rb_tree_node_base *)pQVar7);
      this_00 = pQVar7;
      pScene = local_48;
    }
    uVar8 = (uint)((ulong)((long)iStack_80._M_current - (long)local_88) >> 3);
    pScene->mNumMeshes = uVar8;
    if (uVar8 != 0) {
      ppaVar4 = (aiMesh **)operator_new__((long)iStack_80._M_current - (long)local_88 & 0x7fffffff8)
      ;
      pScene->mMeshes = ppaVar4;
      if (iStack_80._M_current != local_88) {
        uVar5 = 0;
        do {
          if (local_88[uVar5] != (aiMesh *)0x0) {
            pScene->mMeshes[uVar5] = local_88[uVar5];
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 < (ulong)((long)iStack_80._M_current - (long)local_88 >> 3));
      }
    }
    pParent->mNumChildren = (uint)((ulong)((long)iStack_80._M_current - (long)local_88) >> 3);
    ppaVar6 = (aiNode **)operator_new__((ulong)pScene->mRootNode->mNumChildren << 3);
    pParent->mChildren = ppaVar6;
    if (iStack_60._M_current != local_68) {
      uVar5 = 0;
      do {
        paVar1 = local_68[uVar5];
        paVar1->mParent = pParent;
        pParent->mChildren[uVar5] = paVar1;
        *pParent->mChildren[uVar5]->mMeshes = (uint)uVar5;
        uVar5 = uVar5 + 1;
      } while (uVar5 < (ulong)((long)iStack_60._M_current - (long)local_68 >> 3));
    }
    if (local_68 != (aiNode **)0x0) {
      operator_delete(local_68,(long)local_58 - (long)local_68);
    }
    if (local_88 != (aiMesh **)0x0) {
      operator_delete(local_88,(long)local_78 - (long)local_88);
    }
  }
  return;
}

Assistant:

void Q3BSPFileImporter::CreateNodes( const Q3BSP::Q3BSPModel *pModel, aiScene* pScene,
        aiNode *pParent ) {
    if ( nullptr == pModel ) {
        return;
    }

    unsigned int matIdx( 0 );
    std::vector<aiMesh*> MeshArray;
    std::vector<aiNode*> NodeArray;
    for ( FaceMapIt it = m_MaterialLookupMap.begin(); it != m_MaterialLookupMap.end(); ++it ) {
        std::vector<Q3BSP::sQ3BSPFace*> *pArray = (*it).second;
        size_t numVerts = countData( *pArray );
        if ( 0 != numVerts ) {
            aiMesh *pMesh( nullptr );
            aiNode *pNode = CreateTopology( pModel, matIdx, *pArray, &pMesh );
            if ( nullptr != pNode ) {
                NodeArray.push_back( pNode );
                MeshArray.push_back( pMesh );
            }
        }
        matIdx++;
    }

    pScene->mNumMeshes = static_cast<unsigned int>( MeshArray.size() );
    if ( pScene->mNumMeshes > 0 ) {
        pScene->mMeshes = new aiMesh*[ pScene->mNumMeshes ];
        for ( size_t i = 0; i < MeshArray.size(); i++ ) {
            aiMesh *pMesh = MeshArray[ i ];
            if ( nullptr != pMesh ) {
                pScene->mMeshes[ i ] = pMesh;
            }
        }
    }

    pParent->mNumChildren = static_cast<unsigned int>(MeshArray.size());
    pParent->mChildren = new aiNode*[ pScene->mRootNode->mNumChildren ];
    for ( size_t i=0; i<NodeArray.size(); i++ ) {
        aiNode *pNode = NodeArray[ i ];
        pNode->mParent = pParent;
        pParent->mChildren[ i ] = pNode;
        pParent->mChildren[ i ]->mMeshes[ 0 ] = static_cast<unsigned int>(i);
    }
}